

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O0

void __thiscall
CmdLineArgsParser::ParseRange(CmdLineArgsParser *this,Range *pRange,Range *oppositeRange)

{
  char16 cVar1;
  Exception *pEVar2;
  SourceFunctionNode local_30;
  SourceFunctionNode r2;
  SourceFunctionNode r1;
  Range *oppositeRange_local;
  Range *pRange_local;
  CmdLineArgsParser *this_local;
  
  r2 = ParseSourceFunctionIds(this);
  Js::SourceFunctionNode::SourceFunctionNode(&local_30);
  cVar1 = CurChar(this);
  if ((cVar1 == L'\0') || (cVar1 == L' ')) {
    Js::RangeBase<Js::SourceFunctionNode>::Add
              (&pRange->super_RangeBase<Js::SourceFunctionNode>,r2,
               &oppositeRange->super_RangeBase<Js::SourceFunctionNode>);
  }
  else if (cVar1 == L',') {
    Js::RangeBase<Js::SourceFunctionNode>::Add
              (&pRange->super_RangeBase<Js::SourceFunctionNode>,r2,
               &oppositeRange->super_RangeBase<Js::SourceFunctionNode>);
    NextChar(this);
    ParseRange(this,pRange,oppositeRange);
  }
  else {
    if (cVar1 != L'-') {
      pEVar2 = (Exception *)__cxa_allocate_exception(8);
      Exception::Exception(pEVar2,L"Unexpected character while parsing Range");
      __cxa_throw(pEVar2,&Exception::typeinfo,0);
    }
    NextChar(this);
    local_30 = ParseSourceFunctionIds(this);
    if (local_30.sourceContextId < r2.sourceContextId) {
      pEVar2 = (Exception *)__cxa_allocate_exception(8);
      Exception::Exception(pEVar2,L"Left source index must be smaller than the Right source Index");
      __cxa_throw(pEVar2,&Exception::typeinfo,0);
    }
    if (r2.sourceContextId == local_30.sourceContextId) {
      if (local_30.functionId < r2.functionId) {
        pEVar2 = (Exception *)__cxa_allocate_exception(8);
        Exception::Exception
                  (pEVar2,
                   L"Left functionId must be smaller than the Right functionId when Source file is the same"
                  );
        __cxa_throw(pEVar2,&Exception::typeinfo,0);
      }
    }
    Js::RangeBase<Js::SourceFunctionNode>::Add
              (&pRange->super_RangeBase<Js::SourceFunctionNode>,r2,local_30,
               &oppositeRange->super_RangeBase<Js::SourceFunctionNode>);
    cVar1 = CurChar(this);
    if ((cVar1 != L'\0') && (cVar1 != L' ')) {
      if (cVar1 != L',') {
        pEVar2 = (Exception *)__cxa_allocate_exception(8);
        Exception::Exception(pEVar2,L"Unexpected character while parsing Range");
        __cxa_throw(pEVar2,&Exception::typeinfo,0);
      }
      NextChar(this);
      ParseRange(this,pRange,oppositeRange);
    }
  }
  return;
}

Assistant:

void
CmdLineArgsParser::ParseRange(Js::Range *pRange, Js::Range *oppositeRange)
{
    SourceFunctionNode r1 = ParseSourceFunctionIds();
    SourceFunctionNode r2;
    switch(CurChar())
    {
    case '-':
        NextChar();
        r2 = ParseSourceFunctionIds();

        if (r1.sourceContextId > r2.sourceContextId)
        {
            throw Exception(_u("Left source index must be smaller than the Right source Index"));
        }
        if ((r1.sourceContextId == r2.sourceContextId) &&
            (r1.functionId > r2.functionId))
        {
            throw Exception(_u("Left functionId must be smaller than the Right functionId when Source file is the same"));
        }

        pRange->Add(r1, r2, oppositeRange);
        switch(CurChar())
        {
        case ',':
            NextChar();
            ParseRange(pRange, oppositeRange);
            break;

        case ' ':
        case 0:
            break;

        default:
            throw Exception(_u("Unexpected character while parsing Range"));
        }
        break;

    case ',':
        pRange->Add(r1, oppositeRange);
        NextChar();
        ParseRange(pRange, oppositeRange);
        break;

    case ' ':
    case 0:
        pRange->Add(r1, oppositeRange);
        break;

    default:
        throw Exception(_u("Unexpected character while parsing Range"));
    }

}